

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.hpp
# Opt level: O2

SPIRType * __thiscall
diligent_spirv_cross::Compiler::set<diligent_spirv_cross::SPIRType,spv::Op>
          (Compiler *this,uint32_t id,Op *args)

{
  SPIRType *pSVar1;
  
  ParsedIR::add_typed_id(&this->ir,TypeType,(ID)id);
  pSVar1 = variant_set<diligent_spirv_cross::SPIRType,spv::Op>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + id,args);
  (pSVar1->super_IVariant).self.id = id;
  return pSVar1;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		set_initializers(var);
		return var;
	}